

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O3

void __thiscall
iDynTree::optimalcontrol::LinearConstraint::LinearConstraint
          (LinearConstraint *this,size_t size,string *name)

{
  pointer pcVar1;
  LinearConstraintImplementation *this_00;
  string local_40;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
  Constraint::Constraint(&this->super_Constraint,size,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_Constraint)._vptr_Constraint = (_func_int **)&PTR__LinearConstraint_0019a1d0;
  this_00 = (LinearConstraintImplementation *)operator_new(0x140);
  LinearConstraintImplementation::LinearConstraintImplementation(this_00,size);
  this->m_pimpl = this_00;
  return;
}

Assistant:

LinearConstraint::LinearConstraint(size_t size, const std::string name)
        : Constraint(size, name)
        , m_pimpl(new LinearConstraintImplementation(size))
        { }